

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O2

void CVmObjBigNum::increment_abs(char *ext)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  ulong i;
  ushort uVar4;
  bool bVar5;
  
  uVar4 = *(ushort *)(ext + 2);
  uVar1 = 0;
  if (0 < (short)uVar4) {
    uVar1 = uVar4;
  }
  if (uVar1 <= *(ushort *)ext) {
    i = (ulong)uVar1;
    sVar2 = uVar1 * 4;
    while( true ) {
      sVar2 = sVar2 + -4;
      i = i - 1;
      if (i == 0xffffffffffffffff) break;
      uVar3 = (uint)(int)ext[(i >> 1) + 5] >> (~(byte)sVar2 & 4) & 0xf;
      if (uVar3 != 9) {
        set_dig(ext,i,uVar3 + 1);
        goto LAB_002640e9;
      }
      ext[(i >> 1) + 5] = '\x0f' << ((byte)sVar2 & 4) & ext[(i >> 1) + 5];
    }
    do {
      shift_right(ext,1);
      sVar2 = *(short *)(ext + 2);
      *(ushort *)(ext + 2) = sVar2 + 1U;
      bVar5 = (short)uVar4 < 0;
      uVar4 = sVar2 + 1U;
    } while (bVar5);
    ext[5] = ext[5] & 0xfU | 0x10;
LAB_002640e9:
    ext[4] = ext[4] & 0xf7;
  }
  return;
}

Assistant:

void CVmObjBigNum::increment_abs(char *ext)
{
    size_t idx;
    int exp = get_exp(ext);
    int carry;

    /* start at the one's place, if represented */
    idx = (exp <= 0 ? 0 : (size_t)exp);

    /* 
     *   if the units digit is to the right of the number (i.e., the number's
     *   scale is large), there's nothing to do 
     */
    if (idx > get_prec(ext))
        return;

    /* increment digits */
    for (carry = TRUE ; idx != 0 ; )
    {
        int dig;

        /* move to the next digit */
        --idx;

        /* get the digit value */
        dig = get_dig(ext, idx);

        /* increment it, checking for carry */
        if (dig == 9)
        {
            /* increment it to zero and keep going to carry */
            set_dig(ext, idx, 0);
        }
        else
        {
            /* increment this digit */
            set_dig(ext, idx, dig + 1);

            /* there's no carry out */
            carry = FALSE;

            /* done */
            break;
        }
    }

    /* if we carried past the end of the number, insert the leading 1 */
    if (carry)
    {
        /* 
         *   if we still haven't reached the units position, shift right
         *   until we do 
         */
        while (get_exp(ext) < 0)
        {
            /* shift it right and adjust the exponent */
            shift_right(ext, 1);
            set_exp(ext, get_exp(ext) + 1);
        }

        /* shift the number right and adjust the exponent */
        shift_right(ext, 1);
        set_exp(ext, get_exp(ext) + 1);

        /* insert the leading 1 */
        set_dig(ext, 0, 1);
    }

    /* we know the value is now non-zero */
    ext[VMBN_FLAGS] &= ~VMBN_F_ZERO;
}